

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O0

void __thiscall cmCPackLog::~cmCPackLog(cmCPackLog *this)

{
  cmCPackLog *this_local;
  
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackLog_00b16270;
  SetLogOutputStream(this,(ostream *)0x0);
  std::__cxx11::string::~string((string *)&this->LogOutputFileName);
  std::__cxx11::string::~string((string *)&this->ErrorPrefix);
  std::__cxx11::string::~string((string *)&this->WarningPrefix);
  std::__cxx11::string::~string((string *)&this->DebugPrefix);
  std::__cxx11::string::~string((string *)&this->VerbosePrefix);
  std::__cxx11::string::~string((string *)&this->OutputPrefix);
  std::__cxx11::string::~string((string *)&this->Prefix);
  cmObject::~cmObject(&this->super_cmObject);
  return;
}

Assistant:

cmCPackLog::~cmCPackLog()
{
  this->SetLogOutputStream(0);
}